

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::iterate(DrawCallBatchingTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  TestLog *pTVar3;
  TestContext *this_00;
  pointer puVar4;
  int iVar5;
  long *plVar6;
  int iVar7;
  double *pdVar8;
  long *plVar9;
  int precision;
  ulong uVar10;
  long lVar11;
  long lVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  char *pcVar13;
  long lVar14;
  long lVar15;
  iterator __position;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ScopedLogSection section;
  Statistics unbatchedStats;
  ScopedLogSection section_1;
  allocator<char> local_299;
  double *local_298;
  double local_290;
  pointer local_288;
  double local_280;
  Statistics local_278;
  long lStack_260;
  string local_258;
  double local_238;
  ScopedLogSection local_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  double local_208;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [6];
  ios_base local_190 [8];
  ios_base local_188 [264];
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  switch(this->m_state) {
  case STATE_LOG_INFO:
    pTVar3 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    local_1f0[0]._M_allocated_capacity = 0x666e692074736554;
    local_1f0[0]._8_2_ = 0x6f;
    local_200._8_8_ = 9;
    local_258.field_2._M_allocated_capacity = 0x666e692074736554;
    local_258.field_2._8_2_ = 0x6f;
    local_258._M_string_length = 9;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_200._0_8_ = local_200 + 0x10;
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_278,pTVar3,(string *)local_200,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
    poVar1 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Rendering using ",0x10);
    bVar2 = (this->m_spec).useDrawElements;
    pcVar13 = "glDrawArrays()";
    if (bVar2 != false) {
      pcVar13 = "glDrawElements()";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,pcVar13,(ulong)bVar2 * 2 + 0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_188);
    if ((this->m_spec).useDrawElements == true) {
      poVar1 = (ostringstream *)(local_200 + 8);
      local_200._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Using ",6);
      bVar2 = (this->m_spec).dynamicIndices;
      pcVar13 = "";
      if (bVar2 != false) {
        pcVar13 = "dynamic ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,pcVar13,(ulong)bVar2 << 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"indices from ",0xd);
      uVar10 = (ulong)(this->m_spec).useIndexBuffer;
      pcVar13 = "pointer";
      if (uVar10 != 0) {
        pcVar13 = "buffer";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,uVar10 ^ 7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_188);
    }
    if (0 < (this->m_spec).staticAttributeCount) {
      poVar1 = (ostringstream *)(local_200 + 8);
      local_200._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Using ",6);
      std::ostream::operator<<(poVar1,(this->m_spec).staticAttributeCount);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," static attribute",0x11)
      ;
      iVar5 = (this->m_spec).staticAttributeCount;
      pcVar13 = "";
      if (1 < iVar5) {
        pcVar13 = "s";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,pcVar13,(ulong)(1 < iVar5));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," from ",6);
      uVar10 = (ulong)(this->m_spec).useStaticBuffer;
      pcVar13 = "pointer";
      if (uVar10 != 0) {
        pcVar13 = "buffer";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,uVar10 ^ 7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_188);
    }
    if (0 < (this->m_spec).dynamicAttributeCount) {
      poVar1 = (ostringstream *)(local_200 + 8);
      local_200._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Using ",6);
      std::ostream::operator<<(poVar1,(this->m_spec).dynamicAttributeCount);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," dynamic attribute",0x12);
      iVar5 = (this->m_spec).dynamicAttributeCount;
      pcVar13 = "";
      if (1 < iVar5) {
        pcVar13 = "s";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,pcVar13,(ulong)(1 < iVar5));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," from ",6);
      uVar10 = (ulong)(this->m_spec).useDynamicBuffer;
      pcVar13 = "pointer";
      if (uVar10 != 0) {
        pcVar13 = "buffer";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,uVar10 ^ 7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_188);
    }
    poVar1 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Rendering ",10);
    std::ostream::operator<<(poVar1,(this->m_spec).drawCallCount);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," draw calls with ",0x11);
    std::ostream::operator<<(poVar1,(this->m_spec).triangleCount);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," triangles per call.",0x14);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_188);
    tcu::TestLog::endSection((TestLog *)local_278.mean);
    this->m_state = STATE_WARMUP_BATCHED;
    break;
  case STATE_WARMUP_BATCHED:
    renderBatched(this);
    this->m_state = STATE_WARMUP_UNBATCHED;
    break;
  case STATE_WARMUP_UNBATCHED:
    renderUnbatched(this);
    this->m_state = STATE_SAMPLE;
    break;
  case STATE_CALC_CALIBRATION:
    pTVar3 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<((ostringstream *)local_200,this->m_sampleIteration);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x672dd7);
    pdVar8 = (double *)(plVar6 + 2);
    if ((double *)*plVar6 == pdVar8) {
      local_278.standardErrorOfMean = *pdVar8;
      lStack_260 = plVar6[3];
      local_278.mean = (double)&local_278.standardErrorOfMean;
    }
    else {
      local_278.standardErrorOfMean = *pdVar8;
      local_278.mean = (double)*plVar6;
    }
    local_278.standardDeviation = (double)plVar6[1];
    *plVar6 = (long)pdVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,(char *)local_278.mean,&local_299);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,this->m_sampleIteration);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_80,0,(char *)0x0,0x672dd7);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_218 = *plVar9;
      lStack_210 = plVar6[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar9;
      local_228 = (long *)*plVar6;
    }
    local_220 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,(char *)local_228,(allocator<char> *)local_200);
    tcu::ScopedLogSection::ScopedLogSection(&local_230,pTVar3,&local_258,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((double *)local_278.mean != &local_278.standardErrorOfMean) {
      operator_delete((void *)local_278.mean,(long)local_278.standardErrorOfMean + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    calculateStats((Statistics *)&local_258,&this->m_unbatchedSamplesUs);
    calculateStats(&local_278,&this->m_batchedSamplesUs);
    poVar1 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Batched samples; Count: ",0x18);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", Mean: ",8);
    local_298 = (double *)local_278.mean;
    std::ostream::_M_insert<double>(local_278.mean);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"us, Standard deviation: ",0x18);
    local_238 = local_278.standardDeviation;
    std::ostream::_M_insert<double>(local_278.standardDeviation);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"us, Standard error of mean: ",0x1c);
    local_290 = local_278.standardErrorOfMean;
    std::ostream::_M_insert<double>(local_278.standardErrorOfMean);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"us(",3);
    local_290 = local_290 / (double)local_298;
    std::ostream::_M_insert<double>(local_290);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_188);
    poVar1 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Unbatched samples; Count: ",0x1a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", Mean: ",8);
    local_288 = local_258._M_dataplus._M_p;
    std::ostream::_M_insert<double>((double)local_258._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"us, Standard deviation: ",0x18);
    local_208 = (double)local_258._M_string_length;
    std::ostream::_M_insert<double>((double)local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"us, Standard error of mean: ",0x1c);
    local_280 = (double)local_258.field_2._M_allocated_capacity;
    std::ostream::_M_insert<double>((double)local_258.field_2._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"us(",3);
    local_280 = local_280 / (double)local_288;
    std::ostream::_M_insert<double>(local_280);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_188);
    iVar5 = this->m_sampleIteration;
    if (iVar5 < 3) {
      if (local_290 + local_280 <= 0.05 && 0 < iVar5) {
        if (2 < iVar5) goto LAB_00421c03;
        goto LAB_00421c5b;
      }
      if (0.02 < local_280) {
        poVar1 = (ostringstream *)(local_200 + 8);
        local_200._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Unbatched standard error of mean outside of range.",0x32);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_188);
      }
      if (0.02 < local_290) {
        poVar1 = (ostringstream *)(local_200 + 8);
        local_200._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Batched standard error of mean outside of range.",0x30);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_188);
      }
      if (local_208 <= 0.0) {
        iVar5 = (int)((ulong)((long)(this->m_unbatchedSamplesUs).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_unbatchedSamplesUs).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      }
      else {
        dVar16 = (local_208 / (double)local_288) / 0.02;
        iVar5 = (int)(dVar16 * dVar16);
        iVar7 = (int)((ulong)((long)(this->m_unbatchedSamplesUs).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_unbatchedSamplesUs).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if (iVar5 < iVar7) {
          iVar5 = iVar7;
        }
      }
      this->m_unbatchedSampleCount = iVar5;
      if (local_238 <= 0.0) {
        iVar5 = (int)((ulong)((long)(this->m_batchedSamplesUs).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_batchedSamplesUs).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      }
      else {
        dVar16 = (local_238 / (double)local_298) / 0.02;
        iVar5 = (int)(dVar16 * dVar16);
        iVar7 = (int)((ulong)((long)(this->m_batchedSamplesUs).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_batchedSamplesUs).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if (iVar5 < iVar7) {
          iVar5 = iVar7;
        }
      }
      this->m_batchedSampleCount = iVar5;
      puVar4 = (this->m_batchedSamplesUs).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_batchedSamplesUs).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar4) {
        (this->m_batchedSamplesUs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar4;
      }
      puVar4 = (this->m_unbatchedSamplesUs).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_unbatchedSamplesUs).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar4) {
        (this->m_unbatchedSamplesUs).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar4;
      }
      this->m_sampleIteration = this->m_sampleIteration + 1;
      this->m_state = STATE_SAMPLE;
      bVar2 = true;
    }
    else {
LAB_00421c03:
      poVar1 = (ostringstream *)(local_200 + 8);
      local_200._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Maximum iteration count reached.",0x20);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_188);
LAB_00421c5b:
      poVar1 = (ostringstream *)(local_200 + 8);
      local_200._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Standard errors in target range.",0x20);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_188);
      poVar1 = (ostringstream *)(local_200 + 8);
      local_200._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Batched/Unbatched ratio: ",0x19);
      local_298 = (double *)((double)local_298 / (double)local_288);
      std::ostream::_M_insert<double>((double)local_298);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_188);
      this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
      de::floatToString_abi_cxx11_((string *)local_200,(de *)0x1,(float)(double)local_298,precision)
      ;
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_200._0_8_);
      if ((TestLog *)local_200._0_8_ != (TestLog *)(local_200 + 0x10)) {
        operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
    tcu::TestLog::endSection(local_230.m_log);
    if (!bVar2) {
      return STOP;
    }
    break;
  case STATE_SAMPLE:
    lVar14 = (long)(this->m_unbatchedSamplesUs).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_unbatchedSamplesUs).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
    lVar15 = lVar14 >> 3;
    iVar5 = (int)lVar15;
    if (iVar5 < this->m_unbatchedSampleCount) {
      lVar11 = (long)(this->m_batchedSamplesUs).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_batchedSamplesUs).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      lVar12 = lVar11 >> 3;
      iVar7 = (int)lVar12;
      if ((iVar7 < this->m_batchedSampleCount) &&
         (auVar17._8_4_ = (int)(lVar14 >> 0x23), auVar17._0_8_ = lVar15, auVar17._12_4_ = 0x45300000
         , auVar18._8_4_ = (int)(lVar11 >> 0x23), auVar18._0_8_ = lVar12,
         auVar18._12_4_ = 0x45300000,
         ((auVar18._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0)) /
         (double)this->m_batchedSampleCount <=
         ((auVar17._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0)) /
         (double)this->m_unbatchedSampleCount)) goto LAB_00421662;
      local_200._0_8_ = renderUnbatched(this);
      __position._M_current =
           (this->m_unbatchedSamplesUs).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (this->m_unbatchedSamplesUs).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = local_200._0_8_;
        (this->m_unbatchedSamplesUs).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
        return CONTINUE;
      }
      this_01 = &this->m_unbatchedSamplesUs;
    }
    else {
LAB_00421662:
      if (this->m_batchedSampleCount <=
          (int)((ulong)((long)(this->m_batchedSamplesUs).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_batchedSamplesUs).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        this->m_state = STATE_CALC_CALIBRATION;
        return CONTINUE;
      }
      local_200._0_8_ = renderBatched(this);
      __position._M_current =
           (this->m_batchedSamplesUs).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (this->m_batchedSamplesUs).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = local_200._0_8_;
        (this->m_batchedSamplesUs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        return CONTINUE;
      }
      this_01 = &this->m_batchedSamplesUs;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (this_01,__position,(unsigned_long *)local_200);
  }
  return CONTINUE;
}

Assistant:

tcu::TestCase::IterateResult DrawCallBatchingTest::iterate (void)
{
	if (m_state == STATE_LOG_INFO)
	{
		logTestInfo();
		m_state = STATE_WARMUP_BATCHED;
	}
	else if (m_state == STATE_WARMUP_BATCHED)
	{
		renderBatched();
		m_state = STATE_WARMUP_UNBATCHED;
	}
	else if (m_state == STATE_WARMUP_UNBATCHED)
	{
		renderUnbatched();
		m_state = STATE_SAMPLE;
	}
	else if (m_state == STATE_SAMPLE)
	{
		if ((int)m_unbatchedSamplesUs.size() < m_unbatchedSampleCount && ((double)m_unbatchedSamplesUs.size() / ((double)m_unbatchedSampleCount) < (double)m_batchedSamplesUs.size() / ((double)m_batchedSampleCount) || (int)m_batchedSamplesUs.size() >= m_batchedSampleCount))
			m_unbatchedSamplesUs.push_back(renderUnbatched());
		else if ((int)m_batchedSamplesUs.size() < m_batchedSampleCount)
			m_batchedSamplesUs.push_back(renderBatched());
		else
			m_state = STATE_CALC_CALIBRATION;
	}
	else if (m_state == STATE_CALC_CALIBRATION)
	{
		TestLog& log = m_testCtx.getLog();

		tcu::ScopedLogSection	section(log, ("Sampling iteration " + de::toString(m_sampleIteration)).c_str(), ("Sampling iteration " + de::toString(m_sampleIteration)).c_str());
		const double targetSEM	= 0.02;
		const double limitSEM	= 0.025;

		Statistics unbatchedStats	= calculateStats(m_unbatchedSamplesUs);
		Statistics batchedStats		= calculateStats(m_batchedSamplesUs);

		log << TestLog::Message << "Batched samples; Count: " << m_batchedSamplesUs.size() << ", Mean: " << batchedStats.mean << "us, Standard deviation: " << batchedStats.standardDeviation << "us, Standard error of mean: " << batchedStats.standardErrorOfMean << "us(" << (batchedStats.standardErrorOfMean/batchedStats.mean) << ")" << TestLog::EndMessage;
		log << TestLog::Message << "Unbatched samples; Count: " << m_unbatchedSamplesUs.size() << ", Mean: " << unbatchedStats.mean << "us, Standard deviation: " << unbatchedStats.standardDeviation << "us, Standard error of mean: " << unbatchedStats.standardErrorOfMean << "us(" << (unbatchedStats.standardErrorOfMean/unbatchedStats.mean) << ")" << TestLog::EndMessage;

		if (m_sampleIteration > 2 || (m_sampleIteration > 0 && (unbatchedStats.standardErrorOfMean/unbatchedStats.mean) + (batchedStats.standardErrorOfMean/batchedStats.mean) <= 2.0 * limitSEM))
		{
			if (m_sampleIteration > 2)
				log << TestLog::Message << "Maximum iteration count reached." << TestLog::EndMessage;

			log << TestLog::Message << "Standard errors in target range." << TestLog::EndMessage;
			log << TestLog::Message << "Batched/Unbatched ratio: " << (batchedStats.mean / unbatchedStats.mean) << TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)(batchedStats.mean/unbatchedStats.mean), 1).c_str());
			return STOP;
		}
		else
		{
			if ((unbatchedStats.standardErrorOfMean/unbatchedStats.mean) > targetSEM)
				log << TestLog::Message << "Unbatched standard error of mean outside of range." << TestLog::EndMessage;

			if ((batchedStats.standardErrorOfMean/batchedStats.mean) > targetSEM)
				log << TestLog::Message << "Batched standard error of mean outside of range." << TestLog::EndMessage;

			if (unbatchedStats.standardDeviation > 0.0)
			{
				double x = (unbatchedStats.standardDeviation / unbatchedStats.mean) / targetSEM;
				m_unbatchedSampleCount = std::max((int)m_unbatchedSamplesUs.size(), (int)(x * x));
			}
			else
				m_unbatchedSampleCount = (int)m_unbatchedSamplesUs.size();

			if (batchedStats.standardDeviation > 0.0)
			{
				double x = (batchedStats.standardDeviation / batchedStats.mean) / targetSEM;
				m_batchedSampleCount = std::max((int)m_batchedSamplesUs.size(), (int)(x * x));
			}
			else
				m_batchedSampleCount = (int)m_batchedSamplesUs.size();

			m_batchedSamplesUs.clear();
			m_unbatchedSamplesUs.clear();

			m_sampleIteration++;
			m_state = STATE_SAMPLE;
		}
	}
	else
		DE_ASSERT(false);

	return CONTINUE;
}